

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

size_t __thiscall caffe::NetParameter::ByteSizeLong(NetParameter *this)

{
  UnknownFieldSet *unknown_fields;
  Type *value;
  size_t sVar1;
  Type *value_00;
  Type *value_01;
  Type *value_02;
  size_t sVar2;
  uint i_1;
  uint index;
  uint uVar3;
  long lVar4;
  uint i;
  uint uVar5;
  
  uVar5 = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar1 = 0;
  }
  else {
    unknown_fields = NetParameter::unknown_fields(this);
    sVar1 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar3 = (this->layers_).super_RepeatedPtrFieldBase.current_size_;
  lVar4 = sVar1 + uVar3;
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                      (&(this->layers_).super_RepeatedPtrFieldBase,uVar5);
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<caffe::V1LayerParameter>(value);
    lVar4 = lVar4 + sVar1;
  }
  uVar5 = (this->input_).super_RepeatedPtrFieldBase.current_size_;
  lVar4 = lVar4 + (ulong)uVar5;
  uVar3 = 0;
  index = 0;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
    index = 0;
  }
  for (; uVar3 != index; index = index + 1) {
    value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->input_).super_RepeatedPtrFieldBase,index);
    sVar1 = google::protobuf::internal::WireFormatLite::StringSize(value_00);
    lVar4 = lVar4 + sVar1;
  }
  sVar1 = google::protobuf::internal::WireFormatLite::Int32Size(&this->input_dim_);
  uVar5 = (this->input_shape_).super_RepeatedPtrFieldBase.current_size_;
  lVar4 = sVar1 + lVar4 + (ulong)(uint)(this->input_dim_).current_size_ + (ulong)uVar5;
  for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    value_01 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
                         (&(this->input_shape_).super_RepeatedPtrFieldBase,uVar3);
    sVar1 = google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual<caffe::BlobShape>
                      (value_01);
    lVar4 = lVar4 + sVar1;
  }
  uVar5 = (this->layer_).super_RepeatedPtrFieldBase.current_size_;
  sVar1 = lVar4 + (ulong)uVar5 * 2;
  for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    value_02 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         (&(this->layer_).super_RepeatedPtrFieldBase,uVar3);
    sVar2 = google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual<caffe::LayerParameter>
                      (value_02);
    sVar1 = sVar1 + sVar2;
  }
  uVar5 = (this->_has_bits_).has_bits_[0];
  if ((uVar5 & 0xf) != 0) {
    if ((uVar5 & 1) != 0) {
      sVar2 = google::protobuf::internal::WireFormatLite::StringSize((this->name_).ptr_);
      sVar1 = sVar1 + sVar2 + 1;
      uVar5 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar5 & 2) != 0) {
      sVar2 = google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual<caffe::NetState>
                        (this->state_);
      sVar1 = sVar1 + sVar2 + 1;
      uVar5 = (this->_has_bits_).has_bits_[0];
    }
    sVar1 = (ulong)(uVar5 >> 2 & 2) + (uVar5 >> 1 & 2) + sVar1;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t NetParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.NetParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .caffe.V1LayerParameter layers = 2;
  {
    unsigned int count = this->layers_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->layers(i));
    }
  }

  // repeated string input = 3;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->input_size());
  for (int i = 0, n = this->input_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->input(i));
  }

  // repeated int32 input_dim = 4;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int32Size(this->input_dim_);
    total_size += 1 *
                  ::google::protobuf::internal::FromIntSize(this->input_dim_size());
    total_size += data_size;
  }

  // repeated .caffe.BlobShape input_shape = 8;
  {
    unsigned int count = this->input_shape_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->input_shape(i));
    }
  }

  // repeated .caffe.LayerParameter layer = 100;
  {
    unsigned int count = this->layer_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->layer(i));
    }
  }

  if (_has_bits_[0 / 32] & 15u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional .caffe.NetState state = 6;
    if (has_state()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->state_);
    }

    // optional bool force_backward = 5 [default = false];
    if (has_force_backward()) {
      total_size += 1 + 1;
    }

    // optional bool debug_info = 7 [default = false];
    if (has_debug_info()) {
      total_size += 1 + 1;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}